

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintMiterStatus(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  
  uVar2 = p->vCos->nSize;
  iVar3 = p->nRegs;
  uVar8 = uVar2 - iVar3;
  if (uVar8 == 0 || (int)uVar2 < iVar3) {
    uVar10 = 0;
    uVar7 = 0;
    uVar11 = 0;
  }
  else {
    uVar12 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar12;
    }
    uVar11 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      if (uVar9 == uVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = p->vCos->pArray[uVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar5 + iVar4;
      pGVar13 = (Gia_Obj_t *)
                ((ulong)((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) ^
                (ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)));
      if (pGVar5 == pGVar13) {
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      else if ((((ulong)pGVar13 ^ (ulong)pGVar5) == 1) ||
              ((uVar6 = *(undefined8 *)
                         ((ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) &
                         0xfffffffffffffffe), (~(uint)uVar6 & 0x9fffffff) == 0 &&
               ((int)((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff) < p->vCis->nSize - iVar3)))) {
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      else {
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
  }
  Abc_Print((int)p,"Outputs = %7d.  Unsat = %7d.  Sat = %7d.  Undec = %7d.\n",(ulong)uVar8,uVar7,
            uVar10,uVar11);
  return;
}

Assistant:

void Gia_ManPrintMiterStatus( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pChild;
    int i, nSat = 0, nUnsat = 0, nUndec = 0, iOut = -1;
    Gia_ManForEachPo( p, pObj, i )
    {
        pChild = Gia_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Gia_ManConst0(p) )
            nUnsat++;
        // check if the output is constant 1
        else if ( pChild == Gia_ManConst1(p) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        // check if the output is a primary input
        else if ( Gia_ObjIsPi(p, Gia_Regular(pChild)) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
/*
        // check if the output is 1 for the 0000 pattern
        else if ( Gia_Regular(pChild)->fPhase != (unsigned)Gia_IsComplement(pChild) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
*/
        else
            nUndec++;
    }
    Abc_Print( 1, "Outputs = %7d.  Unsat = %7d.  Sat = %7d.  Undec = %7d.\n",
        Gia_ManPoNum(p), nUnsat, nSat, nUndec );
}